

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

string * __thiscall
Kernel::Clause::toNiceString_abi_cxx11_(string *__return_storage_ptr__,Clause *this)

{
  SplitSet *pSVar1;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  literalsOnlyToString_abi_cxx11_(__return_storage_ptr__,this);
  pSVar1 = (this->super_Unit)._inference._splits;
  if ((pSVar1 != (SplitSet *)0x0) && (pSVar1->_size != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70," {",&local_91);
    Lib::SharedSet<unsigned_int>::toString_abi_cxx11_
              (&local_90,(this->super_Unit)._inference._splits);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_30,&local_50,"}");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Clause::toNiceString() const
{
  std::string result = literalsOnlyToString();

  if (splits() && !splits()->isEmpty()) {
    result += std::string(" {") + splits()->toString() + "}";
  }

  return result;
}